

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

Stream * __thiscall kratos::Stream::operator<<(Stream *this,shared_ptr<kratos::Var> *var)

{
  undefined1 *puVar1;
  element_type *peVar2;
  ostream *poVar3;
  Var *in_RDX;
  Var *extraout_RDX;
  Var *extraout_RDX_00;
  undefined1 local_50 [8];
  string var_str;
  
  if ((((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
      comment._M_string_length != 0) {
    puVar1 = &(this->super_stringstream).field_0x10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"// ",3);
    strip_newline((string *)local_50,
                  &(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   super_IRNode).comment);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)puVar1,(char *)local_50,(long)var_str._M_dataplus._M_p);
    puVar1 = &(this->super_stringstream).field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    var_str.field_2._M_local_buf[0xf] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,var_str.field_2._M_local_buf + 0xf,1);
    in_RDX = extraout_RDX;
    if (local_50 != (undefined1  [8])&var_str._M_string_length) {
      operator_delete((void *)local_50,var_str._M_string_length + 1);
      in_RDX = extraout_RDX_00;
    }
  }
  if (*(char *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) == '\x01') {
    (((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_IRNode).
    verilog_ln = *(uint32_t *)&(this->super_stringstream).field_0x90;
  }
  get_var_decl_abi_cxx11_
            ((string *)local_50,
             (Stream *)(var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             in_RDX);
  peVar2 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&(this->super_stringstream).field_0x10,
                      (peVar2->before_var_str_)._M_dataplus._M_p,
                      (peVar2->before_var_str_)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_50,(long)var_str._M_dataplus._M_p);
  peVar2 = (var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(peVar2->after_var_str_)._M_dataplus._M_p,
                      (peVar2->after_var_str_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
  puVar1 = &(this->super_stringstream).field_0x90;
  *(long *)puVar1 = *(long *)puVar1 + 1;
  var_str.field_2._M_local_buf[0xf] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,var_str.field_2._M_local_buf + 0xf,1);
  if (local_50 != (undefined1  [8])&var_str._M_string_length) {
    operator_delete((void *)local_50,var_str._M_string_length + 1);
  }
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::shared_ptr<Var>& var) {
    if (!var->comment.empty()) (*this) << "// " << strip_newline(var->comment) << endl();

    if (generator_->debug) {
        var->verilog_ln = line_no_;
    }

    auto var_str = get_var_decl(var.get());

    (*this) << var->before_var_str() << var_str << var->after_var_str() << ";" << endl();
    return *this;
}